

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O2

bool Am_Connection::Register_Type
               (Am_Value_Type type,Am_Marshall_Method *marshall,Am_Unmarshall_Method *unmarshall,
               unsigned_long id)

{
  bool bVar1;
  mapped_type_conflict *pmVar2;
  unsigned_short aKey;
  key_type local_50;
  Am_Value local_40;
  
  if (id == 0) {
    id_count = id_count + 1;
    bVar1 = true;
    id = id_count;
  }
  else {
    OpenAmulet::Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_>::GetAt
              ((Map<unsigned_short,_Am_Value,_std::less<unsigned_short>_> *)&local_40,
               (unsigned_short *)&Net_IDs);
    bVar1 = Am_Value::operator!=(&local_40,0);
    Am_Value::~Am_Value(&local_40);
    if (bVar1) {
      std::operator<<((ostream *)&std::cerr,"Declared duplicate type! Overwriting...");
    }
    bVar1 = !bVar1;
    if (id_count <= id) {
      id_count = id;
    }
  }
  local_50.type = 2;
  local_50.value.long_value._2_6_ = 0;
  local_50.value.long_value._0_2_ = type;
  pmVar2 = std::
           map<Am_Value,_unsigned_short,_std::less<Am_Value>,_std::allocator<std::pair<const_Am_Value,_unsigned_short>_>_>
           ::operator[](&Types.mMap,&local_50);
  aKey = (unsigned_short)id;
  *pmVar2 = aKey;
  Am_Value::~Am_Value(&local_50);
  OpenAmulet::Map<unsigned_short,_Am_Marshall_Method,_std::less<unsigned_short>_>::SetAt
            (&Marshall_Methods,aKey,*marshall);
  OpenAmulet::Map<unsigned_short,_Am_Unmarshall_Method,_std::less<unsigned_short>_>::SetAt
            (&Unmarshall_Methods,aKey,*unmarshall);
  return bVar1;
}

Assistant:

bool
Am_Connection::Register_Type(Am_Value_Type type,
                             const Am_Marshall_Method &marshall,
                             const Am_Unmarshall_Method &unmarshall,
                             unsigned long id)
{
  bool was_empty = true;

  // Am_Network will generate an ID
  if (id == 0) {
    id = ++id_count;
  } else // The user provided an ID
  {
    // The id provided is already registered!
    if (Net_IDs.GetAt(id) != (0L)) {
      std::cerr << "Declared duplicate type! Overwriting...";
      was_empty = false;
    }

    id_count = (id > id_count ? id : id_count);
  }

  Types.SetAt(type, id);
  Marshall_Methods.SetAt(id, marshall);
  Unmarshall_Methods.SetAt(id, unmarshall);

  return (was_empty);
}